

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int mov_a_indir_rx(em8051 *aCPU)

{
  uchar uVar1;
  uint uVar2;
  int value;
  int address;
  em8051 *aCPU_local;
  
  uVar2 = (uint)aCPU->mLowerData
                [(int)((aCPU->mCodeMem[(int)(aCPU->mPC & aCPU->mCodeMemSize - 1U)] & 1) +
                      ((int)(aCPU->mSFR[0x50] & 0x18) >> 3) * 8)];
  if (uVar2 < 0x80) {
    aCPU->mSFR[0x60] = aCPU->mLowerData[(int)uVar2];
  }
  else {
    uVar1 = 'w';
    if (aCPU->mUpperData != (uchar *)0x0) {
      uVar1 = aCPU->mUpperData[(int)(uVar2 - 0x80)];
    }
    aCPU->mSFR[0x60] = uVar1;
  }
  aCPU->mPC = aCPU->mPC + 1;
  return 0;
}

Assistant:

static int mov_a_indir_rx(struct em8051 *aCPU)
{
    int address = INDIR_RX_ADDRESS;
    if (address > 0x7f)
    {
        int value = BAD_VALUE;
        if (aCPU->mUpperData)
        {
            value = aCPU->mUpperData[address - 0x80];
        }

        ACC = value;
    }
    else
    {
        ACC = aCPU->mLowerData[address];
    }

    PC++;
    return 0;
}